

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkSamplerCreateInfo *
vk::mapSampler(VkSamplerCreateInfo *__return_storage_ptr__,Sampler *sampler,TextureFormat *format,
              float minLod,float maxLod)

{
  TextureChannelClass channelClass;
  VkBorderColor VVar1;
  VkFilter VVar2;
  VkSamplerMipmapMode VVar3;
  VkSamplerAddressMode VVar4;
  bool bVar5;
  bool bVar6;
  float local_64;
  float local_54;
  VkCompareOp local_44;
  bool isMipmapEnabled;
  VkBorderColor borderColor;
  VkCompareOp compareOp;
  bool compareEnabled;
  float maxLod_local;
  float minLod_local;
  TextureFormat *format_local;
  Sampler *sampler_local;
  
  bVar5 = sampler->compare == COMPAREMODE_NONE;
  if (bVar5) {
    local_44 = VK_COMPARE_OP_ALWAYS;
  }
  else {
    local_44 = mapCompareMode(sampler->compare);
  }
  channelClass = tcu::getTextureChannelClass(format->type);
  VVar1 = mapBorderColor(channelClass,&sampler->borderColor);
  bVar6 = false;
  if (sampler->minFilter != NEAREST) {
    bVar6 = sampler->minFilter != LINEAR;
  }
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  VVar2 = mapFilterMode(sampler->magFilter);
  __return_storage_ptr__->magFilter = VVar2;
  VVar2 = mapFilterMode(sampler->minFilter);
  __return_storage_ptr__->minFilter = VVar2;
  VVar3 = mapMipmapMode(sampler->minFilter);
  __return_storage_ptr__->mipmapMode = VVar3;
  VVar4 = mapWrapMode(sampler->wrapS);
  __return_storage_ptr__->addressModeU = VVar4;
  VVar4 = mapWrapMode(sampler->wrapT);
  __return_storage_ptr__->addressModeV = VVar4;
  VVar4 = mapWrapMode(sampler->wrapR);
  __return_storage_ptr__->addressModeW = VVar4;
  __return_storage_ptr__->mipLodBias = 0.0;
  __return_storage_ptr__->anisotropyEnable = 0;
  __return_storage_ptr__->maxAnisotropy = 1.0;
  __return_storage_ptr__->compareEnable = (uint)!bVar5;
  __return_storage_ptr__->compareOp = local_44;
  local_54 = minLod;
  if (!bVar6) {
    local_54 = 0.0;
  }
  __return_storage_ptr__->minLod = local_54;
  local_64 = maxLod;
  if (!bVar6) {
    local_64 = 0.25;
  }
  __return_storage_ptr__->maxLod = local_64;
  __return_storage_ptr__->borderColor = VVar1;
  __return_storage_ptr__->unnormalizedCoordinates = (uint)((sampler->normalizedCoords & 1U) == 0);
  return __return_storage_ptr__;
}

Assistant:

VkSamplerCreateInfo mapSampler (const tcu::Sampler& sampler, const tcu::TextureFormat& format, float minLod, float maxLod)
{
	const bool					compareEnabled	= (sampler.compare != tcu::Sampler::COMPAREMODE_NONE);
	const VkCompareOp			compareOp		= (compareEnabled) ? (mapCompareMode(sampler.compare)) : (VK_COMPARE_OP_ALWAYS);
	const VkBorderColor			borderColor		= mapBorderColor(getTextureChannelClass(format.type), sampler.borderColor);
	const bool					isMipmapEnabled	= (sampler.minFilter != tcu::Sampler::NEAREST && sampler.minFilter != tcu::Sampler::LINEAR);

	const VkSamplerCreateInfo	createInfo		=
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
		DE_NULL,
		(VkSamplerCreateFlags)0,
		mapFilterMode(sampler.magFilter),							// magFilter
		mapFilterMode(sampler.minFilter),							// minFilter
		mapMipmapMode(sampler.minFilter),							// mipMode
		mapWrapMode(sampler.wrapS),									// addressU
		mapWrapMode(sampler.wrapT),									// addressV
		mapWrapMode(sampler.wrapR),									// addressW
		0.0f,														// mipLodBias
		VK_FALSE,													// anisotropyEnable
		1.0f,														// maxAnisotropy
		(VkBool32)(compareEnabled ? VK_TRUE : VK_FALSE),			// compareEnable
		compareOp,													// compareOp
		(isMipmapEnabled ? minLod : 0.0f),							// minLod
		(isMipmapEnabled ? maxLod : 0.25f),							// maxLod
		borderColor,												// borderColor
		(VkBool32)(sampler.normalizedCoords ? VK_FALSE : VK_TRUE),	// unnormalizedCoords
	};

	return createInfo;
}